

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 1005.cpp
# Opt level: O2

int f(int i,int s1,int s2)

{
  int iVar1;
  int iVar2;
  
  if (n == i) {
    iVar2 = s1 - s2;
    iVar1 = -iVar2;
    if (0 < iVar2) {
      iVar1 = iVar2;
    }
    if (min_ <= iVar1) {
      iVar1 = min_;
    }
  }
  else {
    f(i + 1,a.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            [i] + s1,s2);
    f(i + 1,s1,s2 + a.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start[i]);
    iVar1 = min_;
  }
  min_ = iVar1;
  return min_;
}

Assistant:

int f(int i, int s1, int s2) {
    if (i == n) {
        min_ = std::min(min_, abs(s1 - s2));
    } else {
        f(i + 1, s1 + a[i], s2);
        f(i + 1, s1, s2 + a[i]);
    }
    return min_;
}